

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

shared_ptr<const_helics::SmallBuffer> * __thiscall
helics::CommonCore::getValue(CommonCore *this,InterfaceHandle handle,uint32_t *inputIndex)

{
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
  *p_Var1;
  FederateState *this_00;
  shared_ptr<const_helics::SmallBuffer> *psVar2;
  InvalidIdentifier *this_01;
  char *pcVar3;
  string_view message;
  size_t sStack_20;
  
  p_Var1 = getHandleInfo(this,handle);
  if (p_Var1 == (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                 *)0x0) {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar3 = "Handle is invalid (getValue)";
    sStack_20 = 0x1c;
  }
  else {
    if ((p_Var1->
        super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
        ).
        super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
        ._M_storage._M_storage.__data[4] == 'i') {
      this_00 = getFederateAt(this,(LocalFederateId)
                                   *(BaseType *)
                                    &(p_Var1->
                                     super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                                     ).
                                     super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
                                     ._M_storage._M_storage);
      FederateState::sleeplock(this_00);
      psVar2 = FederateState::getValue(this_00,handle,inputIndex);
      LOCK();
      (this_00->processing).super___atomic_flag_base._M_i = false;
      UNLOCK();
      return psVar2;
    }
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar3 = "Handle does not identify an input";
    sStack_20 = 0x21;
  }
  message._M_str = pcVar3;
  message._M_len = sStack_20;
  InvalidIdentifier::InvalidIdentifier(this_01,message);
  __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

const std::shared_ptr<const SmallBuffer>& CommonCore::getValue(InterfaceHandle handle,
                                                               uint32_t* inputIndex)
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw(InvalidIdentifier("Handle is invalid (getValue)"));
    }

    if (handleInfo->handleType != InterfaceType::INPUT) {
        throw(InvalidIdentifier("Handle does not identify an input"));
    }
    auto& fed = *getFederateAt(handleInfo->local_fed_id);
    const std::lock_guard<FederateState> lock(fed);
    return fed.getValue(handle, inputIndex);
}